

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>::iterator,_phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>::iterator>
* __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
::equal_range<phmap::priv::hash_internal::EnumClass>
          (pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>::iterator,_phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>::iterator>
           *__return_storage_ptr__,
          raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
          *this,key_arg<phmap::priv::hash_internal::EnumClass> *key)

{
  char *pcVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  iterator iVar10;
  undefined1 auVar11 [11];
  undefined1 auVar12 [12];
  undefined1 auVar13 [13];
  undefined1 auVar14 [14];
  ctrl_t *pcVar15;
  char *pcVar16;
  anon_union_8_1_a8a14541_for_iterator_1 aVar17;
  uint uVar18;
  char in_XMM1_Ba;
  char in_XMM1_Bb;
  char in_XMM1_Bc;
  char in_XMM1_Bd;
  char in_XMM1_Be;
  char in_XMM1_Bf;
  char in_XMM1_Bg;
  char in_XMM1_Bh;
  char in_XMM1_Bi;
  char in_XMM1_Bj;
  char in_XMM1_Bk;
  char in_XMM1_Bl;
  char in_XMM1_Bm;
  char in_XMM1_Bn;
  char in_XMM1_Bo;
  byte in_XMM1_Bp;
  iterator iVar19;
  
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *key;
  iVar19 = find<phmap::priv::hash_internal::EnumClass>
                     (this,key,SUB168(ZEXT816(0xde5fb9d2630458e9) * auVar3,8) +
                               SUB168(ZEXT816(0xde5fb9d2630458e9) * auVar3,0));
  pcVar15 = iVar19.ctrl_;
  iVar10 = iVar19;
  if (pcVar15 != this->ctrl_ + this->capacity_) {
    aVar17.slot_ = iVar19.field_1.slot_ + 1;
    pcVar16 = pcVar15 + 1;
    if (pcVar15[1] < -1) {
      do {
        iVar6 = -(uint)(CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))) ==
                       CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))));
        iVar7 = -(uint)(CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))) ==
                       CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))));
        iVar8 = -(uint)(CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))) ==
                       CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))));
        iVar9 = -(uint)(CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))) ==
                       CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))));
        in_XMM1_Ba = -(*pcVar16 < (char)iVar6);
        in_XMM1_Bb = -(pcVar16[1] < (char)((uint)iVar6 >> 8));
        in_XMM1_Bc = -(pcVar16[2] < (char)((uint)iVar6 >> 0x10));
        in_XMM1_Bd = -(pcVar16[3] < (char)((uint)iVar6 >> 0x18));
        in_XMM1_Be = -(pcVar16[4] < (char)iVar7);
        in_XMM1_Bf = -(pcVar16[5] < (char)((uint)iVar7 >> 8));
        in_XMM1_Bg = -(pcVar16[6] < (char)((uint)iVar7 >> 0x10));
        in_XMM1_Bh = -(pcVar16[7] < (char)((uint)iVar7 >> 0x18));
        in_XMM1_Bi = -(pcVar16[8] < (char)iVar8);
        in_XMM1_Bj = -(pcVar16[9] < (char)((uint)iVar8 >> 8));
        in_XMM1_Bk = -(pcVar16[10] < (char)((uint)iVar8 >> 0x10));
        in_XMM1_Bl = -(pcVar16[0xb] < (char)((uint)iVar8 >> 0x18));
        in_XMM1_Bm = -(pcVar16[0xc] < (char)iVar9);
        in_XMM1_Bn = -(pcVar16[0xd] < (char)((uint)iVar9 >> 8));
        in_XMM1_Bo = -(pcVar16[0xe] < (char)((uint)iVar9 >> 0x10));
        in_XMM1_Bp = -(pcVar16[0xf] < (char)((uint)iVar9 >> 0x18));
        auVar4[1] = in_XMM1_Bb;
        auVar4[0] = in_XMM1_Ba;
        auVar4[2] = in_XMM1_Bc;
        auVar4[3] = in_XMM1_Bd;
        auVar4[4] = in_XMM1_Be;
        auVar4[5] = in_XMM1_Bf;
        auVar4[6] = in_XMM1_Bg;
        auVar4[7] = in_XMM1_Bh;
        auVar4[8] = in_XMM1_Bi;
        auVar4[9] = in_XMM1_Bj;
        auVar4[10] = in_XMM1_Bk;
        auVar4[0xb] = in_XMM1_Bl;
        auVar4[0xc] = in_XMM1_Bm;
        auVar4[0xd] = in_XMM1_Bn;
        auVar4[0xe] = in_XMM1_Bo;
        auVar4[0xf] = in_XMM1_Bp;
        auVar5[1] = in_XMM1_Bb;
        auVar5[0] = in_XMM1_Ba;
        auVar5[2] = in_XMM1_Bc;
        auVar5[3] = in_XMM1_Bd;
        auVar5[4] = in_XMM1_Be;
        auVar5[5] = in_XMM1_Bf;
        auVar5[6] = in_XMM1_Bg;
        auVar5[7] = in_XMM1_Bh;
        auVar5[8] = in_XMM1_Bi;
        auVar5[9] = in_XMM1_Bj;
        auVar5[10] = in_XMM1_Bk;
        auVar5[0xb] = in_XMM1_Bl;
        auVar5[0xc] = in_XMM1_Bm;
        auVar5[0xd] = in_XMM1_Bn;
        auVar5[0xe] = in_XMM1_Bo;
        auVar5[0xf] = in_XMM1_Bp;
        auVar14[1] = in_XMM1_Bd;
        auVar14[0] = in_XMM1_Bc;
        auVar14[2] = in_XMM1_Be;
        auVar14[3] = in_XMM1_Bf;
        auVar14[4] = in_XMM1_Bg;
        auVar14[5] = in_XMM1_Bh;
        auVar14[6] = in_XMM1_Bi;
        auVar14[7] = in_XMM1_Bj;
        auVar14[8] = in_XMM1_Bk;
        auVar14[9] = in_XMM1_Bl;
        auVar14[10] = in_XMM1_Bm;
        auVar14[0xb] = in_XMM1_Bn;
        auVar14[0xc] = in_XMM1_Bo;
        auVar14[0xd] = in_XMM1_Bp;
        auVar13[1] = in_XMM1_Be;
        auVar13[0] = in_XMM1_Bd;
        auVar13[2] = in_XMM1_Bf;
        auVar13[3] = in_XMM1_Bg;
        auVar13[4] = in_XMM1_Bh;
        auVar13[5] = in_XMM1_Bi;
        auVar13[6] = in_XMM1_Bj;
        auVar13[7] = in_XMM1_Bk;
        auVar13[8] = in_XMM1_Bl;
        auVar13[9] = in_XMM1_Bm;
        auVar13[10] = in_XMM1_Bn;
        auVar13[0xb] = in_XMM1_Bo;
        auVar13[0xc] = in_XMM1_Bp;
        auVar12[1] = in_XMM1_Bf;
        auVar12[0] = in_XMM1_Be;
        auVar12[2] = in_XMM1_Bg;
        auVar12[3] = in_XMM1_Bh;
        auVar12[4] = in_XMM1_Bi;
        auVar12[5] = in_XMM1_Bj;
        auVar12[6] = in_XMM1_Bk;
        auVar12[7] = in_XMM1_Bl;
        auVar12[8] = in_XMM1_Bm;
        auVar12[9] = in_XMM1_Bn;
        auVar12[10] = in_XMM1_Bo;
        auVar12[0xb] = in_XMM1_Bp;
        auVar11[1] = in_XMM1_Bg;
        auVar11[0] = in_XMM1_Bf;
        auVar11[2] = in_XMM1_Bh;
        auVar11[3] = in_XMM1_Bi;
        auVar11[4] = in_XMM1_Bj;
        auVar11[5] = in_XMM1_Bk;
        auVar11[6] = in_XMM1_Bl;
        auVar11[7] = in_XMM1_Bm;
        auVar11[8] = in_XMM1_Bn;
        auVar11[9] = in_XMM1_Bo;
        auVar11[10] = in_XMM1_Bp;
        uVar18 = (ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB141(auVar14 >> 7,0) & 1) << 2 |
                          (ushort)(SUB131(auVar13 >> 7,0) & 1) << 3 |
                          (ushort)(SUB121(auVar12 >> 7,0) & 1) << 4 |
                          (ushort)(SUB111(auVar11 >> 7,0) & 1) << 5 |
                          (ushort)((byte)(CONCAT19(in_XMM1_Bp,
                                                   CONCAT18(in_XMM1_Bo,
                                                            CONCAT17(in_XMM1_Bn,
                                                                     CONCAT16(in_XMM1_Bm,
                                                                              CONCAT15(in_XMM1_Bl,
                                                                                       CONCAT14(
                                                  in_XMM1_Bk,
                                                  CONCAT13(in_XMM1_Bj,
                                                           CONCAT12(in_XMM1_Bi,
                                                                    CONCAT11(in_XMM1_Bh,in_XMM1_Bg))
                                                          ))))))) >> 7) & 1) << 6 |
                          (ushort)((byte)(CONCAT18(in_XMM1_Bp,
                                                   CONCAT17(in_XMM1_Bo,
                                                            CONCAT16(in_XMM1_Bn,
                                                                     CONCAT15(in_XMM1_Bm,
                                                                              CONCAT14(in_XMM1_Bl,
                                                                                       CONCAT13(
                                                  in_XMM1_Bk,
                                                  CONCAT12(in_XMM1_Bj,
                                                           CONCAT11(in_XMM1_Bi,in_XMM1_Bh)))))))) >>
                                         7) & 1) << 7 | (ushort)(in_XMM1_Bp >> 7) << 0xf) + 1;
        uVar2 = 0;
        if (uVar18 != 0) {
          for (; (uVar18 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
          }
        }
        aVar17.slot_ = (slot_type *)((long)aVar17.slot_ + (ulong)(uVar2 << 4));
        iVar10.field_1.slot_ = aVar17.slot_;
        iVar10.ctrl_ = pcVar16 + uVar2;
        pcVar1 = pcVar16 + uVar2;
        pcVar16 = pcVar16 + uVar2;
      } while (*pcVar1 < -1);
    }
    else {
      iVar10.field_1.slot_ = aVar17.slot_;
      iVar10.ctrl_ = pcVar15 + 1;
    }
  }
  __return_storage_ptr__->first = iVar19;
  __return_storage_ptr__->second = iVar10;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, iterator> equal_range(const key_arg<K>& key) {
        auto it = find(key);
        if (it != end()) return {it, std::next(it)};
        return {it, it};
    }